

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

int lyb_skip_subtree(char *data,lyb_state *lybs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  do {
    uVar1 = (uint)lybs->inner_chunks[(long)lybs->used + -1] * 2;
    uVar2 = lyb_read(data + uVar1,(uint8_t *)0x0,lybs->written[(long)lybs->used + -1],lybs);
    if ((int)uVar2 < 0) {
      return -1;
    }
    iVar3 = iVar3 + uVar1 + uVar2;
    data = data + uVar1 + uVar2;
  } while (lybs->written[(long)lybs->used + -1] != 0);
  return iVar3;
}

Assistant:

static int
lyb_skip_subtree(const char *data, struct lyb_state *lybs)
{
    int r, ret = 0;

    do {
        /* first skip any meta information inside */
        r = lybs->inner_chunks[lybs->used - 1] * LYB_META_BYTES;
        data += r;
        ret += r;

        /* then read data */
        ret += (r = lyb_read(data, NULL, lybs->written[lybs->used - 1], lybs));
        LYB_HAVE_READ_RETURN(r, data, -1);
    } while (lybs->written[lybs->used - 1]);

    return ret;
}